

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_server.h
# Opt level: O3

void __thiscall
blcl::net::server_interface<MsgType>::broadcast_message
          (server_interface<MsgType> *this,message<MsgType> *msg,
          shared_ptr<blcl::net::connection<MsgType>_> *ignored_client)

{
  _Elt_pointer psVar1;
  connection<MsgType> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  char *in_RCX;
  shared_ptr<blcl::net::connection<MsgType>_> *extraout_RDX;
  shared_ptr<blcl::net::connection<MsgType>_> *extraout_RDX_00;
  shared_ptr<blcl::net::connection<MsgType>_> *extraout_RDX_01;
  shared_ptr<blcl::net::connection<MsgType>_> *extraout_RDX_02;
  _Elt_pointer psVar2;
  int in_R8D;
  _Map_pointer ppsVar3;
  _Elt_pointer psVar4;
  bool bVar5;
  connection<MsgType> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e0;
  deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
  *local_d8;
  message<MsgType> *local_d0;
  shared_ptr<blcl::net::connection<MsgType>_> *local_c8;
  undefined8 local_c0;
  _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
  local_b8;
  _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
  local_98;
  iterator local_70;
  _Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::shared_ptr<blcl::net::connection<MsgType>_>_&,_std::shared_ptr<blcl::net::connection<MsgType>_>_*>
  local_50;
  
  psVar2 = (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  psVar1 = (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (psVar2 != psVar1) {
    local_d8 = &this->connections_;
    psVar4 = (this->connections_).
             super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last;
    ppsVar3 = (this->connections_).
              super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    bVar5 = false;
    local_d0 = msg;
    local_c8 = ignored_client;
    do {
      this_00 = (psVar2->
                super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      if ((this_00 == (connection<MsgType> *)0x0) ||
         ((this_00->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>.impl_.
          implementation_.super_base_implementation_type.socket_ == -1)) {
        local_e0 = (psVar2->
                   super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
                   _M_refcount._M_pi;
        if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          in_RCX = &__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_e0->_M_use_count = local_e0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_e0->_M_use_count = local_e0->_M_use_count + 1;
          }
        }
        local_e8 = this_00;
        (*this->_vptr_server_interface[3])(this,&local_e8);
        ignored_client = extraout_RDX_00;
        if (local_e0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e0);
          ignored_client = extraout_RDX_01;
        }
        this_01 = (psVar2->
                  super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
                  _M_refcount._M_pi;
        (psVar2->super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
        _M_ptr = (element_type *)0x0;
        (psVar2->super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        bVar5 = true;
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          ignored_client = extraout_RDX_02;
        }
      }
      else if ((this_00 !=
                (local_c8->
                super___shared_ptr<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr) && (this_00->validated_ == true)) {
        connection<MsgType>::send(this_00,(int)local_d0,ignored_client,(size_t)in_RCX,in_R8D);
        ignored_client = extraout_RDX;
      }
      psVar2 = psVar2 + 1;
      if (psVar2 == psVar4) {
        psVar2 = ppsVar3[1];
        ppsVar3 = ppsVar3 + 1;
        psVar4 = psVar2 + 0x20;
      }
    } while (psVar2 != psVar1);
    if (bVar5) {
      local_c0 = 0;
      local_98._M_cur =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_98._M_first =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_first;
      local_98._M_last =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
      local_98._M_node =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_start._M_node;
      local_b8._M_cur =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_b8._M_first =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_first;
      local_b8._M_last =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_last;
      local_b8._M_node =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
      std::
      __remove_if<std::_Deque_iterator<std::shared_ptr<blcl::net::connection<MsgType>>,std::shared_ptr<blcl::net::connection<MsgType>>&,std::shared_ptr<blcl::net::connection<MsgType>>*>,__gnu_cxx::__ops::_Iter_equals_val<decltype(nullptr)const>>
                (&local_50,&local_98,&local_b8,(_Iter_equals_val<const_std::nullptr_t>)&local_c0);
      local_b8._M_cur =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      local_b8._M_node =
           (this->connections_).
           super__Deque_base<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_node;
      local_98._M_cur = local_50._M_cur;
      local_98._M_first = *local_50._M_node;
      local_98._M_last = local_98._M_first + 0x20;
      local_98._M_node = local_50._M_node;
      local_b8._M_first = *local_b8._M_node;
      local_b8._M_last = local_b8._M_first + 0x20;
      std::
      deque<std::shared_ptr<blcl::net::connection<MsgType>_>,_std::allocator<std::shared_ptr<blcl::net::connection<MsgType>_>_>_>
      ::_M_erase(&local_70,local_d8,&local_98,&local_b8);
    }
  }
  return;
}

Assistant:

void broadcast_message(const message<T>& msg, std::shared_ptr<connection<T>> ignored_client = nullptr) {
            bool invalid_client_exists = false;

            for (auto& client: connections_) {
                if (client && client->is_connected()) {
                    if (client != ignored_client && client->is_validated())
                        client->send(msg);
                } else {
                    on_client_disconnect(client);
                    client.reset();
                    invalid_client_exists = true;
                }
            }

            if (invalid_client_exists)
                connections_.erase(
                        std::remove(connections_.begin(), connections_.end(), nullptr), connections_.end());
        }